

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZQuadraticTetra> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *str;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  TPZQuadraticTetra *in_stack_ffffffffffffff90;
  undefined1 local_29 [41];
  
  str = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  uVar1 = Hash(str);
  iVar2 = TPZGeoEl::ClassId((TPZGeoEl *)0x1811076);
  pzgeom::TPZQuadraticTetra::TPZQuadraticTetra((TPZQuadraticTetra *)CONCAT44(uVar1,iVar2));
  iVar3 = pzgeom::TPZQuadraticTetra::ClassId(in_stack_ffffffffffffff90);
  pzgeom::TPZQuadraticTetra::~TPZQuadraticTetra((TPZQuadraticTetra *)0x18110c3);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}